

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTextIO.cpp
# Opt level: O1

void __thiscall NaTextStreamFile::GetVarNameList(NaTextStreamFile *this,int *nVars,char ***sVars)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  iVar1 = this->nVar;
  *nVars = iVar1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)iVar1) {
    uVar5 = (long)iVar1 * 8;
  }
  ppcVar2 = (char **)operator_new__(uVar5);
  *sVars = ppcVar2;
  if (0 < this->nVar) {
    uVar5 = 0;
    do {
      pcVar3 = (char *)operator_new__(0xd);
      (*sVars)[uVar5] = pcVar3;
      if (**sVars == (char *)0x0) {
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 4;
        __cxa_throw(puVar4,&NaException::typeinfo,0);
      }
      ppcVar2 = *sVars + uVar5;
      uVar5 = uVar5 + 1;
      sprintf(*ppcVar2,"%s_%d","VAR",uVar5 & 0xffffffff);
    } while ((long)uVar5 < (long)this->nVar);
  }
  return;
}

Assistant:

void    NaTextStreamFile::GetVarNameList (int& nVars, char**& sVars)
{
    nVars = nVar;

    sVars = new char*[nVars];
    if(NULL == sVars)
        throw(na_bad_alloc);

    int    i;
    for(i = 0; i < nVar; ++i){
        sVars[i] = new char[10 + strlen(NaVAR_NAME)];
        if(NULL == sVars[0])
            throw(na_bad_alloc);
        sprintf(sVars[i], "%s_%d", NaVAR_NAME, i + 1);
    }
}